

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeMallocByTemporarlySwitchingOffMalloc_Test
::
~TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeMallocByTemporarlySwitchingOffMalloc_Test
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeMallocByTemporarlySwitchingOffMalloc_Test
           *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, UseNativeMallocByTemporarlySwitchingOffMalloc)
{
    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
#ifdef CPPUTEST_USE_MALLOC_MACROS
    #undef malloc
    #undef free
#endif

#if CPPUTEST_USE_STD_C_LIB
    void* memory = malloc(10);
    LONGS_EQUAL(memLeaks, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
    free (memory);
#else
    void* memory = PlatformSpecificMalloc(10);
    LONGS_EQUAL(memLeaks, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
    PlatformSpecificFree (memory);
#endif

#ifdef CPPUTEST_USE_MALLOC_MACROS
#include "CppUTest/MemoryLeakDetectorMallocMacros.h"
#endif
}